

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcDimensionCurveTerminator::~IfcDimensionCurveTerminator
          (IfcDimensionCurveTerminator *this)

{
  undefined1 *puVar1;
  pointer pcVar2;
  void *pvVar3;
  
  *(undefined8 *)
   &(this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
    super_IfcAnnotationOccurrence.super_IfcStyledItem = 0x8f5f40;
  *(undefined8 *)&this->field_0xd8 = 0x8f6030;
  (this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
  super_IfcAnnotationOccurrence.super_IfcStyledItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>._vptr_ObjectHelper =
       (_func_int **)0x8f5f68;
  *(undefined8 *)
   &(this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
    super_IfcAnnotationOccurrence.super_IfcStyledItem.field_0x70 = 0x8f5f90;
  *(undefined8 *)
   &(this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
    super_IfcAnnotationOccurrence.super_IfcStyledItem.field_0x80 = 0x8f5fb8;
  *(undefined8 *)
   &(this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
    super_IfcAnnotationOccurrence.field_0x90 = 0x8f5fe0;
  *(undefined8 *)&(this->super_IfcTerminatorSymbol).field_0xa8 = 0x8f6008;
  puVar1 = *(undefined1 **)&(this->super_IfcTerminatorSymbol).field_0xb8;
  if (puVar1 != &this->field_0xc8) {
    operator_delete(puVar1);
  }
  *(undefined8 *)
   &(this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
    super_IfcAnnotationOccurrence.super_IfcStyledItem = 0x8f63e8;
  *(undefined8 *)&this->field_0xd8 = 0x8f6438;
  (this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
  super_IfcAnnotationOccurrence.super_IfcStyledItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>._vptr_ObjectHelper =
       (_func_int **)0x8f6410;
  pcVar2 = (this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
           super_IfcAnnotationOccurrence.super_IfcStyledItem.Name.ptr._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 !=
      &(this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
       super_IfcAnnotationOccurrence.super_IfcStyledItem.Name.ptr.field_2) {
    operator_delete(pcVar2);
  }
  pvVar3 = *(void **)&(this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
                      super_IfcAnnotationOccurrence.super_IfcStyledItem.
                      super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>.field_0x20;
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3);
  }
  operator_delete(this);
  return;
}

Assistant:

IfcDimensionCurveTerminator() : Object("IfcDimensionCurveTerminator") {}